

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  ulong uVar1;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  allocator<char> local_1a0;
  allocator<char> local_19f;
  allocator<char> local_19e;
  allocator<char> local_19d;
  TestShaderType local_19c;
  string variable_declaration;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string variable_initializations [8];
  
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  local_19c = tested_shader_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&variable_declaration,"float x[1][1][1][1][1][1][1][1];\n\n",
             (allocator<char> *)variable_initializations);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)variable_initializations,
             "x[0]                      = float[1][1][1][1][1][1][1](float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));\n"
             ,(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 1),
             "x[0][0]                   = float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));\n"
             ,&local_19d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 2),
             "x[0][0][0]                = float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n"
             ,&local_19e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 3),
             "x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n"
             ,&local_19f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 4),
             "x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",&local_1a0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 5),
             "x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n",&local_1a1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 6),"x[0][0][0][0][0][0][0]    = float[1](1.0);\n"
             ,&local_1a2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(variable_initializations + 7),"x[0][0][0][0][0][0][0][0] = 1.0;\n",
             &local_1a3);
  uVar1 = (ulong)local_19c;
  std::operator+(&local_158,&variable_declaration,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_);
  std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::operator+(&local_158,"    ",variable_initializations);
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_158);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_19c) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xc7f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b8fb75::switchdataD_0171c494 +
         (long)(int)(&switchD_00b8fb75::switchdataD_0171c494)[uVar1]) {
  case 0xb8fb77:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb8fb88:
  case 0xb8fb8f:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_0171c4ac + *(int *)(&DAT_0171c4ac + uVar1 * 4)))
            (&DAT_0171c4ac + *(int *)(&DAT_0171c4ac + uVar1 * 4),empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_);
  return;
}

Assistant:

void ExpressionsIndexingArray1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source;
	std::string variable_declaration = "float x[1][1][1][1][1][1][1][1];\n\n";

	std::string variable_initializations[] = {
		"x[0]                      = float[1][1][1][1][1][1][1]("
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));"
		"\n",
		"x[0][0]                   = "
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));"
		"\n",
		"x[0][0][0]                = "
		"float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n",
		"x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n",
		"x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",
		"x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n", "x[0][0][0][0][0][0][0]    = float[1](1.0);\n",
		"x[0][0][0][0][0][0][0][0] = 1.0;\n"
	};

	for (size_t string_index = 0; string_index < sizeof(variable_initializations) / sizeof(variable_initializations[0]);
		 string_index++)
	{
		shader_source = variable_declaration + shader_start;
		shader_source += "    " + variable_initializations[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}